

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# yolov3detection.cpp
# Opt level: O0

int __thiscall
ncnn::Yolov3Detection::forward
          (Yolov3Detection *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  int iVar1;
  ulong uVar2;
  bool bVar3;
  const_reference pvVar4;
  size_type sVar5;
  reference pvVar6;
  float *pfVar7;
  reference this_00;
  size_type sVar8;
  reference pvVar9;
  undefined8 in_RCX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RDX;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *in_RSI;
  long in_RDI;
  double dVar10;
  float *outptr;
  ObjectBox *r;
  size_t i;
  Mat *top_blob;
  vector<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_> detected_objects;
  ObjectBox object;
  float prob;
  float score;
  int q;
  float class_score;
  int class_index;
  float box_score;
  float ymax;
  float xmax;
  float ymin;
  float xmin;
  float box_h;
  float box_w;
  int x_offset;
  int y_offset;
  float bias_h;
  float bias_w;
  int real_h;
  int real_w;
  int h;
  int w;
  Mat scores;
  float *box_score_ptr;
  float *hptr;
  float *wptr;
  float *yptr;
  float *xptr;
  Mat boxes_score;
  Mat locations;
  Mat *bottom_blob;
  int front_mat_channels;
  int current_mat_index;
  int p;
  int pp;
  ObjectsManager objects;
  int channels_per_box;
  size_t b;
  int prob_steps;
  vector<int,_std::allocator<int>_> mat_steps_channels;
  int channels;
  Mat *in_stack_fffffffffffffbb0;
  undefined7 in_stack_fffffffffffffbb8;
  undefined1 in_stack_fffffffffffffbbf;
  reference in_stack_fffffffffffffbc0;
  Mat *in_stack_fffffffffffffbc8;
  vector<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_> *pvVar11;
  undefined4 in_stack_fffffffffffffbd0;
  float in_stack_fffffffffffffbd4;
  size_t in_stack_fffffffffffffbd8;
  float in_stack_fffffffffffffbe0;
  float in_stack_fffffffffffffbe4;
  vector<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_> *in_stack_fffffffffffffbe8;
  ObjectsManager *in_stack_fffffffffffffbf0;
  size_type local_3a8;
  vector<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_> local_398;
  float local_37c;
  float local_378;
  float local_374;
  float local_370;
  float local_36c;
  int local_368;
  float local_364;
  Mat local_360;
  float local_31c;
  int local_318;
  float local_314;
  int local_310;
  float local_30c;
  float local_308;
  float local_304;
  float local_300;
  float local_2fc;
  float local_2f8;
  float local_2f4;
  int local_2f0;
  int local_2ec;
  float local_2e8;
  float local_2e4;
  int local_2e0;
  int local_2dc;
  int local_2d8;
  int local_2d4;
  undefined1 local_2d0 [64];
  Mat local_290;
  float *local_250;
  Mat local_248;
  float *local_208;
  Mat local_200;
  float *local_1c0;
  Mat local_1b8;
  float *local_178;
  Mat local_170;
  float *local_130;
  undefined1 local_128 [64];
  undefined1 local_e8 [64];
  const_reference local_a8;
  value_type local_a0;
  int local_9c;
  int local_98;
  int local_94;
  undefined4 local_68;
  int local_64;
  ulong local_60;
  int local_58;
  vector<int,_std::allocator<int>_> local_48;
  int local_2c;
  undefined8 local_28;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_20;
  vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *local_18;
  int local_4;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  pvVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](in_RSI,0);
  local_2c = pvVar4->c;
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x1b6d67);
  std::vector<int,_std::allocator<int>_>::push_back
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffbc0,
             (value_type_conflict *)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8));
  pvVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,0);
  iVar1 = pvVar4->w;
  pvVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,0);
  local_58 = iVar1 * pvVar4->h;
  local_60 = 1;
  while( true ) {
    uVar2 = local_60;
    sVar5 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::size(local_18);
    if (sVar5 <= uVar2) break;
    pvVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,local_60);
    local_2c = local_2c + pvVar4->c;
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffbc0,
               (value_type_conflict *)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8))
    ;
    pvVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,local_60);
    iVar1 = pvVar4->w;
    pvVar4 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_18,local_60);
    local_58 = (int)((float)(iVar1 * pvVar4->h + local_58) * 0.5);
    local_60 = local_60 + 1;
  }
  local_64 = local_2c / *(int *)(in_RDI + 0xbc);
  if (local_64 == *(int *)(in_RDI + 0xb8) + 5) {
    ObjectsManager::ObjectsManager
              ((ObjectsManager *)CONCAT44(in_stack_fffffffffffffbe4,in_stack_fffffffffffffbe0),
               in_stack_fffffffffffffbd8);
    for (local_94 = 0; local_94 < *(int *)(in_RDI + 0xbc); local_94 = local_94 + 1) {
      local_98 = local_94 * local_64;
      local_9c = 0;
      local_a0 = 0;
      while( true ) {
        iVar1 = local_98;
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_48,(long)local_9c);
        if (iVar1 < *pvVar6) break;
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[](&local_48,(long)local_9c);
        local_a0 = *pvVar6;
        local_9c = local_9c + 1;
      }
      local_a8 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[]
                           (local_18,(long)local_9c);
      local_98 = local_98 - local_a0;
      Mat::channel_range(in_stack_fffffffffffffbc8,(int)((ulong)in_stack_fffffffffffffbc0 >> 0x20),
                         (int)in_stack_fffffffffffffbc0);
      (**(code **)(**(long **)(in_RDI + 0x120) + 0x48))
                (*(long **)(in_RDI + 0x120),local_e8,local_28);
      Mat::channel_range(in_stack_fffffffffffffbc8,(int)((ulong)in_stack_fffffffffffffbc0 >> 0x20),
                         (int)in_stack_fffffffffffffbc0);
      (**(code **)(**(long **)(in_RDI + 0x120) + 0x48))
                (*(long **)(in_RDI + 0x120),local_128,local_28);
      Mat::channel((Mat *)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8),
                   (int)((ulong)in_stack_fffffffffffffbb0 >> 0x20));
      pfVar7 = Mat::operator_cast_to_float_(&local_170);
      Mat::~Mat((Mat *)0x1b711c);
      local_130 = pfVar7;
      Mat::channel((Mat *)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8),
                   (int)((ulong)in_stack_fffffffffffffbb0 >> 0x20));
      pfVar7 = Mat::operator_cast_to_float_(&local_1b8);
      Mat::~Mat((Mat *)0x1b7166);
      local_178 = pfVar7;
      Mat::channel((Mat *)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8),
                   (int)((ulong)in_stack_fffffffffffffbb0 >> 0x20));
      pfVar7 = Mat::operator_cast_to_float_(&local_200);
      Mat::~Mat((Mat *)0x1b71b5);
      local_1c0 = pfVar7;
      Mat::channel((Mat *)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8),
                   (int)((ulong)in_stack_fffffffffffffbb0 >> 0x20));
      pfVar7 = Mat::operator_cast_to_float_(&local_248);
      Mat::~Mat((Mat *)0x1b7204);
      local_208 = pfVar7;
      Mat::channel((Mat *)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8),
                   (int)((ulong)in_stack_fffffffffffffbb0 >> 0x20));
      pfVar7 = Mat::operator_cast_to_float_(&local_290);
      Mat::~Mat((Mat *)0x1b724b);
      local_250 = pfVar7;
      Mat::channel_range(in_stack_fffffffffffffbc8,(int)((ulong)in_stack_fffffffffffffbc0 >> 0x20),
                         (int)in_stack_fffffffffffffbc0);
      if (*(int *)(in_RDI + 200) == 0) {
        (**(code **)(**(long **)(in_RDI + 0x120) + 0x48))
                  (*(long **)(in_RDI + 0x120),local_2d0,local_28);
      }
      else {
        (**(code **)(**(long **)(in_RDI + 0x118) + 0x48))
                  (*(long **)(in_RDI + 0x118),local_2d0,local_28);
      }
      local_2d4 = local_a8->w;
      local_2d8 = local_a8->h;
      local_2e0 = local_2d8;
      local_2dc = local_2d4;
      if ((*(int *)(in_RDI + 0xc4) != 0) && (*(int *)(in_RDI + 0xc0) != 0)) {
        local_2dc = *(int *)(in_RDI + 0xc0);
        local_2e0 = *(int *)(in_RDI + 0xc4);
      }
      in_stack_fffffffffffffbf0 =
           (ObjectsManager *)Mat::operator[]((Mat *)(in_RDI + 0xd8),(long)(local_94 * 2));
      local_2e4 = *(float *)&(in_stack_fffffffffffffbf0->object_boxs_table).
                             super__Vector_base<ncnn::SafeOrderList<ncnn::ObjectBox>_*,_std::allocator<ncnn::SafeOrderList<ncnn::ObjectBox>_*>_>
                             ._M_impl.super__Vector_impl_data._M_start / (float)local_2dc;
      in_stack_fffffffffffffbe8 =
           (vector<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_> *)
           Mat::operator[]((Mat *)(in_RDI + 0xd8),(long)(local_94 * 2 + 1));
      local_2e8 = *(float *)&(in_stack_fffffffffffffbe8->
                             super__Vector_base<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>).
                             _M_impl.super__Vector_impl_data._M_start / (float)local_2e0;
      for (local_2ec = 0; local_2ec < local_2d8; local_2ec = local_2ec + 1) {
        for (local_2f0 = 0; local_2f0 < local_2d4; local_2f0 = local_2f0 + 1) {
          dVar10 = std::exp((double)(ulong)(uint)*local_1c0);
          in_stack_fffffffffffffbe4 = SUB84(dVar10,0);
          local_2f4 = in_stack_fffffffffffffbe4 * local_2e4;
          dVar10 = std::exp((double)(ulong)(uint)*local_208);
          in_stack_fffffffffffffbe0 = SUB84(dVar10,0);
          local_2f8 = in_stack_fffffffffffffbe0 * local_2e8;
          local_2fc = (*local_130 + (float)local_2f0) / (float)local_2d4 - local_2f4 * 0.5;
          local_300 = (*local_178 + (float)local_2ec) / (float)local_2d8 - local_2f8 * 0.5;
          local_304 = local_2fc + local_2f4;
          local_308 = local_300 + local_2f8;
          local_30c = *local_250;
          local_310 = 0;
          local_314 = 0.0;
          for (local_318 = 0; local_318 < *(int *)(in_RDI + 0xb8); local_318 = local_318 + 1) {
            Mat::channel((Mat *)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8),
                         (int)((ulong)in_stack_fffffffffffffbb0 >> 0x20));
            pfVar7 = Mat::row(&local_360,local_2ec);
            in_stack_fffffffffffffbd4 = pfVar7[local_2f0];
            Mat::~Mat((Mat *)0x1b773f);
            if (local_314 < in_stack_fffffffffffffbd4) {
              local_310 = local_318;
              local_314 = in_stack_fffffffffffffbd4;
            }
            local_31c = in_stack_fffffffffffffbd4;
          }
          local_364 = local_30c * local_314;
          if (*(float *)(in_RDI + 0xcc) <= local_364) {
            local_37c = local_2fc;
            local_378 = local_300;
            local_374 = local_304;
            local_370 = local_308;
            local_368 = local_310;
            local_36c = local_364;
            ObjectsManager::add_new_object_box
                      ((ObjectsManager *)in_stack_fffffffffffffbc0,
                       (ObjectBox *)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8));
          }
          local_130 = local_130 + 1;
          local_178 = local_178 + 1;
          local_1c0 = local_1c0 + 1;
          local_208 = local_208 + 1;
          local_250 = local_250 + 1;
        }
      }
      Mat::~Mat((Mat *)0x1b791a);
      Mat::~Mat((Mat *)0x1b7927);
      Mat::~Mat((Mat *)0x1b7934);
    }
    pvVar11 = &local_398;
    std::vector<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>::vector
              ((vector<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_> *)0x1b7988);
    ObjectsManager::do_objects_nms
              (in_stack_fffffffffffffbf0,in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe4,
               in_stack_fffffffffffffbe0);
    this_00 = std::vector<ncnn::Mat,_std::allocator<ncnn::Mat>_>::operator[](local_20,0);
    in_stack_fffffffffffffbc0 = this_00;
    std::vector<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>::size(&local_398);
    Mat::create((Mat *)CONCAT44(in_stack_fffffffffffffbd4,in_stack_fffffffffffffbd0),
                (int)((ulong)pvVar11 >> 0x20),(int)pvVar11,(size_t)in_stack_fffffffffffffbc0,
                (Allocator *)CONCAT17(in_stack_fffffffffffffbbf,in_stack_fffffffffffffbb8));
    bVar3 = Mat::empty(in_stack_fffffffffffffbb0);
    if (bVar3) {
      local_4 = -100;
    }
    else {
      local_3a8 = 0;
      while( true ) {
        sVar5 = local_3a8;
        sVar8 = std::vector<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>::size(&local_398);
        if (sVar8 <= sVar5) break;
        pvVar9 = std::vector<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>::operator[]
                           (&local_398,local_3a8);
        pfVar7 = Mat::row(this_00,(int)local_3a8);
        *pfVar7 = (float)(pvVar9->classid + 1);
        pfVar7[1] = pvVar9->prob;
        pfVar7[2] = pvVar9->xmin;
        pfVar7[3] = pvVar9->ymin;
        pfVar7[4] = pvVar9->xmax;
        pfVar7[5] = pvVar9->ymax;
        local_3a8 = local_3a8 + 1;
      }
      local_4 = 0;
    }
    local_68 = 1;
    std::vector<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_>::~vector
              ((vector<ncnn::ObjectBox,_std::allocator<ncnn::ObjectBox>_> *)
               in_stack_fffffffffffffbc0);
    ObjectsManager::~ObjectsManager((ObjectsManager *)in_stack_fffffffffffffbc0);
  }
  else {
    local_4 = -1;
    local_68 = 1;
  }
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)in_stack_fffffffffffffbc0);
  return local_4;
}

Assistant:

int Yolov3Detection::forward(const std::vector<Mat> &bottom_blobs, std::vector<Mat> &top_blobs, const Option &opt) const
{
    int channels = bottom_blobs[0].c;
    std::vector<int> mat_steps_channels;
    mat_steps_channels.push_back(channels);
    int prob_steps = bottom_blobs[0].w * bottom_blobs[0].h;
    for (size_t b = 1; b < bottom_blobs.size(); b++)
    {
        channels += bottom_blobs[b].c;
        mat_steps_channels.push_back(channels);
        prob_steps += bottom_blobs[b].w * bottom_blobs[b].h;
        prob_steps *= 0.5f;
    }

    const int channels_per_box = channels / box_num;

    // anchor coord + box score + num_class
    if (channels_per_box != 4 + 1 + classes)
        return -1;
        
    ObjectsManager objects(prob_steps * box_num / 20);

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int pp = 0; pp < box_num; pp++)
    {
        int p = pp * channels_per_box;

        int current_mat_index = 0;
        int front_mat_channels = 0;
        while (p >= mat_steps_channels[current_mat_index])
        {
            front_mat_channels = mat_steps_channels[current_mat_index];
            current_mat_index++;
        }

        const Mat &bottom_blob = bottom_blobs[current_mat_index];
        p -= front_mat_channels;

        Mat locations = bottom_blob.channel_range(p, 2);
        sigmoid->forward_inplace(locations, opt);
        Mat boxes_score = bottom_blob.channel_range(p + 4, 1);
        sigmoid->forward_inplace(boxes_score, opt);

        const float *xptr = locations.channel(0);
        const float *yptr = locations.channel(1);
        const float *wptr = bottom_blob.channel(p + 2);
        const float *hptr = bottom_blob.channel(p + 3);

        const float *box_score_ptr = boxes_score.channel(0);

        Mat scores = bottom_blob.channel_range(p + 5, classes);
        if (softmax_enable)
        {
            // softmax class scores
            softmax->forward_inplace(scores, opt);
        }
        else
        {
            // Not use softmax to avoid class competition
            sigmoid->forward_inplace(scores, opt);
        }

        int w = bottom_blob.w;
        int h = bottom_blob.h;

        int real_w = w, real_h = h;
        if (net_height != 0 && net_width != 0)
        {
            real_w = net_width;
            real_h = net_height;
        }

        const float bias_w = biases[pp * 2] / real_w;
        const float bias_h = biases[pp * 2 + 1] / real_h;

        for (int y_offset = 0; y_offset < h; y_offset++)
        {
            for (int x_offset = 0; x_offset < w; x_offset++)
            {

                float box_w = exp(wptr[0]) * bias_w;
                float box_h = exp(hptr[0]) * bias_h;

                float xmin = (xptr[0] + x_offset) / w - box_w * 0.5f;
                float ymin = (yptr[0] + y_offset) / h - box_h * 0.5f;
                float xmax = xmin + box_w;
                float ymax = ymin + box_h;

                // box score
                float box_score = box_score_ptr[0];

                // find class index with max class score
                int class_index = 0;
                float class_score = 0.f;
                for (int q = 0; q < classes; q ++)
                {
                    float score = scores.channel(q).row(y_offset)[x_offset];

                    if (score > class_score)
                    {
                        class_index = q;
                        class_score = score;
                    }
                }

                float prob = box_score * class_score;
                if (prob >= confidence_threshold)
                {
                    ObjectBox object = {
                        .xmin = xmin,
                        .ymin = ymin,
                        .xmax = xmax,
                        .ymax = ymax,
                        .prob = prob,
                        .classid = class_index,
                    };
                    objects.add_new_object_box(object);
                }

                xptr++;
                yptr++;
                wptr++;
                hptr++;

                box_score_ptr++;
            }
        }
    }

    std::vector<ObjectBox> detected_objects;
    objects.do_objects_nms(detected_objects, nms_threshold, confidence_threshold);

    Mat &top_blob = top_blobs[0];
    top_blob.create(6, (int)detected_objects.size(), 4u, opt.blob_allocator);

    if (top_blob.empty())
        return -100;

    for (size_t i = 0; i < detected_objects.size(); i++)
    {
        const ObjectBox &r = detected_objects[i];
        float *outptr = top_blob.row(i);

        outptr[0] = r.classid + 1; // 0 reserve for background
        outptr[1] = r.prob;
        outptr[2] = r.xmin;
        outptr[3] = r.ymin;
        outptr[4] = r.xmax;
        outptr[5] = r.ymax;
    }

    return 0;
}